

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_fraction.h
# Opt level: O1

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_int,9u>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               fraction_t<unsigned_int,_9U> *fmt)

{
  long lVar1;
  ulong uVar2;
  value_type_conflict3 vVar3;
  
  vVar3 = 0;
  uVar2 = 0;
  while (((uVar2 < 9 && (end->m_position != pos->m_position)) &&
         ((byte)(pos->m_cache[pos->m_position] - 0x30U) < 10))) {
    vVar3 = ((uint)(byte)pos->m_cache[pos->m_position] + vVar3 * 10) - 0x30;
    uVar2 = uVar2 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  if (uVar2 != 0) {
    if (uVar2 < 9) {
      lVar1 = uVar2 - 9;
      do {
        vVar3 = vVar3 * 10;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0);
    }
    *fmt->value = vVar3;
  }
  return uVar2 != 0;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, fraction_t<UnsignedInt, Width>& fmt, Others&&... others)
{
    using char_type  = typename iterator_traits<Iterator>::value_type;

    auto x = UnsignedInt{ 0 };
    auto count = std::size_t{ 0 };
    while (count < Width)
    {
        if (pos == end)
            break;

        const char_type ch = *pos;
        if ((ch < char_type{ '0' }) || (ch > char_type{ '9' }))
            break;

        x = 10 * x + static_cast<UnsignedInt>(ch - char_type{ '0' });
        ++count;
        ++pos; 
    }

    if (count == 0)
        return false;

    while (count < Width)
    {
        x = 10 * x;
        ++count;
    }
    
    fmt.value = x;
    return read_impl(pos, end, std::forward<Others>(others)...);
}